

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::output_example(vw *all,cb_explore_adf *c,multi_ex *ec_seq)

{
  int iVar1;
  pointer ppeVar2;
  pointer ppeVar3;
  example *ec;
  action_score *paVar4;
  int *piVar5;
  wclass *pwVar6;
  _func_void_int_string_v_array<char> *p_Var7;
  v_array<char> vVar8;
  ostream *poVar9;
  size_t num_features;
  int *piVar10;
  float *pfVar11;
  ulong uVar12;
  bool test_example;
  iterator __begin1;
  pointer ppeVar13;
  long lVar14;
  long lVar15;
  float loss;
  float fVar16;
  multi_ex *__range1;
  string outputString;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffde8 [11];
  char in_stack_fffffffffffffdf3;
  float fVar17;
  vw *pvVar18;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)ppeVar3 - (long)ppeVar2 != 0) {
    lVar15 = (long)ppeVar3 - (long)ppeVar2 >> 3;
    ec = *ppeVar2;
    paVar4 = (ec->pred).a_s._begin;
    num_features = 0;
    ppeVar13 = ppeVar2;
    do {
      num_features = num_features + (*ppeVar13)->num_features;
      ppeVar13 = ppeVar13 + 1;
    } while (ppeVar13 != ppeVar3);
    fVar17 = (c->gen_cs).known_cost.probability;
    loss = 0.0;
    test_example = 0.0 < fVar17;
    if ((0.0 < fVar17) && (lVar14 = (long)(ec->pred).scalars._end - (long)paVar4, lVar14 != 0)) {
      uVar12 = 0;
      do {
        fVar16 = (c->gen_cs).known_cost.cost / (c->gen_cs).known_cost.probability;
        if ((c->gen_cs).known_cost.action != paVar4[uVar12].action) {
          fVar16 = 0.0;
        }
        loss = loss + fVar16 * paVar4[uVar12].score;
        uVar12 = uVar12 + 1;
      } while ((uVar12 & 0xffffffff) < (ulong)(lVar14 >> 3));
    }
    if (ppeVar3 != ppeVar2) {
      lVar14 = 0;
      do {
        test_example = (bool)(test_example & ppeVar2[lVar14]->test_only);
        lVar14 = lVar14 + 1;
      } while (lVar15 + (ulong)(lVar15 == 0) != lVar14);
    }
    shared_data::update(all->sd,test_example,0.0 < fVar17,loss,ec->weight,num_features);
    piVar10 = (all->final_prediction_sink)._begin;
    piVar5 = (all->final_prediction_sink)._end;
    if (piVar10 != piVar5) {
      do {
        ACTION_SCORE::print_action_score
                  (*piVar10,(v_array<ACTION_SCORE::action_score> *)&(ec->pred).scalars,&ec->tag);
        piVar10 = piVar10 + 1;
      } while (piVar10 != piVar5);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      pwVar6 = (ec->l).cs.costs._begin;
      lVar15 = (long)(ec->l).cs.costs._end - (long)pwVar6;
      if (lVar15 != 0) {
        lVar15 = lVar15 >> 4;
        pfVar11 = &pwVar6->wap_value;
        lVar14 = 0;
        do {
          if (lVar14 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdf3,1);
          }
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdf3 = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffdf3,1);
          std::ostream::_M_insert<double>((double)*pfVar11);
          lVar14 = lVar14 + 1;
          pfVar11 = pfVar11 + 4;
        } while (lVar15 + (ulong)(lVar15 == 0) != lVar14);
      }
      p_Var7 = all->print_text;
      iVar1 = all->raw_prediction;
      pvVar18 = all;
      std::__cxx11::stringbuf::str();
      vVar8._end._3_1_ = in_stack_fffffffffffffdf3;
      vVar8._0_11_ = in_stack_fffffffffffffde8;
      vVar8._end._4_4_ = fVar17;
      vVar8.end_array = (char *)pvVar18;
      vVar8.erase_count = (size_t)ec_seq;
      (*p_Var7)(iVar1,(string)ec->tag,vVar8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    CB::print_update(all,fVar17 <= 0.0,ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_explore_adf& c, multi_ex& ec_seq)
{
  if (ec_seq.size() <= 0)
    return;

  size_t num_features = 0;

  float loss = 0.;

  auto& ec = *ec_seq[0];
  ACTION_SCORE::action_scores preds = ec.pred.a_s;

  for (const auto& example : ec_seq)
  {
    num_features += example->num_features;
  }

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.gen_cs.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq.size(); i++) holdout_example &= ec_seq[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, &ec_seq, true);
}